

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O0

void do_cmd_refill(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *local_20;
  object *obj;
  object *light;
  command *cmd_local;
  
  light = (object *)cmd;
  obj = equipped_item_by_slot_name(player,"light");
  _Var1 = player_get_resume_normal_shape(player,(command_conflict *)light);
  if (_Var1) {
    if ((obj == (object *)0x0) || (_Var1 = tval_is_light(obj), !_Var1)) {
      msg("You are not wielding a light.");
    }
    else {
      _Var1 = flag_has_dbg(obj->flags,5,0x15,"light->flags","OF_NO_FUEL");
      if ((_Var1) ||
         (_Var1 = flag_has_dbg(obj->flags,5,0x14,"light->flags","OF_TAKES_FUEL"), !_Var1)) {
        msg("Your light cannot be refilled.");
      }
      else {
        wVar2 = cmd_get_item((command *)light,"item",&local_20,"Refuel with with fuel source? ",
                             "You have nothing you can refuel with.",obj_can_refill,L'\x0e');
        if (wVar2 == L'\0') {
          refill_lamp(obj,local_20);
          player->upkeep->energy_use = z_info->move_energy / 2;
        }
      }
    }
  }
  return;
}

Assistant:

void do_cmd_refill(struct command *cmd)
{
	struct object *light = equipped_item_by_slot_name(player, "light");
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/* Check what we're wielding. */
	if (!light || !tval_is_light(light)) {
		msg("You are not wielding a light.");
		return;
	} else if (of_has(light->flags, OF_NO_FUEL)
			|| !of_has(light->flags, OF_TAKES_FUEL)) {
		msg("Your light cannot be refilled.");
		return;
	}

	/* Get an item */
	if (cmd_get_item(cmd, "item", &obj,
			"Refuel with with fuel source? ",
			"You have nothing you can refuel with.",
			obj_can_refill,
			USE_INVEN | USE_FLOOR | USE_QUIVER) != CMD_OK) return;

	refill_lamp(light, obj);

	player->upkeep->energy_use = z_info->move_energy / 2;
}